

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O2

void core::image::save_file(Ptr *image,string *filename)

{
  __shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<core::Image<float>const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<core::Image<float>,void>
            (local_28,&image->super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>);
  save_file((ConstPtr *)local_28,filename);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  return;
}

Assistant:

void
save_file (FloatImage::Ptr image, std::string const& filename)
{
    save_file(FloatImage::ConstPtr(image), filename);
}